

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O0

void blend_a64_mask_sx_w16n_sse4_1
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint in_ESI;
  long lVar3;
  long in_RDI;
  long in_R8;
  uint in_R9D;
  undefined8 extraout_XMM0_Qa;
  uint8_t *extraout_XMM0_Qa_00;
  __m128i *v_m0_b_00;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  uint8_t *src1_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  __m128i alVar6;
  long in_stack_00000008;
  __m128i v_res_b;
  __m128i v_m1_b;
  __m128i v_m0_b;
  __m128i v_r_hi_b;
  __m128i v_r_lo_b;
  __m128i v_r1_s_b;
  __m128i v_r0_s_b;
  __m128i v_r1_b;
  __m128i v_r0_b;
  int c;
  __m128i _r;
  __m128i v_maxval_b;
  __m128i v_shuffle_b;
  undefined8 local_1e8;
  uint8_t *src0_00;
  int local_17c;
  long local_138;
  long local_118;
  undefined1 local_c8;
  undefined1 uStack_c7;
  undefined1 uStack_c6;
  undefined1 uStack_c5;
  undefined1 uStack_c4;
  undefined1 uStack_c3;
  undefined1 uStack_c2;
  undefined1 uStack_c1;
  undefined1 uStack_c0;
  undefined1 uStack_bf;
  undefined1 uStack_be;
  undefined1 uStack_bd;
  undefined1 uStack_bc;
  undefined1 uStack_bb;
  undefined1 uStack_ba;
  undefined1 uStack_b9;
  undefined1 local_b8;
  undefined1 uStack_b7;
  undefined1 uStack_b6;
  undefined1 uStack_b5;
  undefined1 uStack_b4;
  undefined1 uStack_b3;
  undefined1 uStack_b2;
  undefined1 uStack_b1;
  undefined1 uStack_b0;
  undefined1 uStack_af;
  undefined1 uStack_ae;
  undefined1 uStack_ad;
  undefined1 uStack_ac;
  undefined1 uStack_ab;
  undefined1 uStack_aa;
  undefined1 uStack_a9;
  undefined4 uStack_40;
  undefined4 uStack_30;
  
  xx_loadu_128("");
  local_138 = in_R8;
  local_118 = in_RDI;
  do {
    for (local_17c = 0; local_17c < (int)v_res_b[1]; local_17c = local_17c + 0x10) {
      xx_loadu_128((void *)(in_stack_00000008 + local_17c * 2));
      src0_00 = extraout_XMM0_Qa_00;
      xx_loadu_128((void *)(in_stack_00000008 + 0x10 + (long)(local_17c * 2)));
      auVar2._8_8_ = extraout_XMM0_Qb_00;
      auVar2._0_8_ = src0_00;
      auVar4._8_8_ = extraout_XMM0_Qb;
      auVar4._0_8_ = extraout_XMM0_Qa;
      auVar4 = pshufb(auVar2,auVar4);
      auVar1._8_8_ = src1_00;
      auVar1._0_8_ = v_m0_b_00;
      auVar5._8_8_ = extraout_XMM0_Qb;
      auVar5._0_8_ = extraout_XMM0_Qa;
      auVar5 = pshufb(auVar1,auVar5);
      local_b8 = (undefined1)uStack_40;
      uStack_b7 = (undefined1)((uint)uStack_40 >> 8);
      uStack_b6 = (undefined1)((uint)uStack_40 >> 0x10);
      uStack_b5 = (undefined1)((uint)uStack_40 >> 0x18);
      uStack_b4 = auVar5[0xc];
      uStack_b3 = auVar5[0xd];
      uStack_b2 = auVar5[0xe];
      uStack_b1 = auVar5[0xf];
      uStack_b0 = auVar5[0];
      uStack_af = auVar5[1];
      uStack_ae = auVar5[2];
      uStack_ad = auVar5[3];
      uStack_ac = auVar5[4];
      uStack_ab = auVar5[5];
      uStack_aa = auVar5[6];
      uStack_a9 = auVar5[7];
      local_c8 = (undefined1)local_1e8;
      uStack_c7 = (undefined1)((ulong)local_1e8 >> 8);
      uStack_c6 = (undefined1)((ulong)local_1e8 >> 0x10);
      uStack_c5 = (undefined1)((ulong)local_1e8 >> 0x18);
      uStack_c4 = (undefined1)((ulong)local_1e8 >> 0x20);
      uStack_c3 = (undefined1)((ulong)local_1e8 >> 0x28);
      uStack_c2 = (undefined1)((ulong)local_1e8 >> 0x30);
      uStack_c1 = (undefined1)((ulong)local_1e8 >> 0x38);
      uStack_c0 = (undefined1)uStack_30;
      uStack_bf = (undefined1)((uint)uStack_30 >> 8);
      uStack_be = (undefined1)((uint)uStack_30 >> 0x10);
      uStack_bd = (undefined1)((uint)uStack_30 >> 0x18);
      uStack_bc = auVar4[0xc];
      uStack_bb = auVar4[0xd];
      uStack_ba = auVar4[0xe];
      uStack_b9 = auVar4[0xf];
      pavgb(local_b8,local_c8);
      pavgb(uStack_b7,uStack_c7);
      pavgb(uStack_b6,uStack_c6);
      pavgb(uStack_b5,uStack_c5);
      pavgb(uStack_b4,uStack_c4);
      pavgb(uStack_b3,uStack_c3);
      pavgb(uStack_b2,uStack_c2);
      pavgb(uStack_b1,uStack_c1);
      pavgb(uStack_b0,uStack_c0);
      pavgb(uStack_af,uStack_bf);
      pavgb(uStack_ae,uStack_be);
      pavgb(uStack_ad,uStack_bd);
      pavgb(uStack_ac,uStack_bc);
      pavgb(uStack_ab,uStack_bb);
      pavgb(uStack_aa,uStack_ba);
      pavgb(uStack_a9,uStack_b9);
      lVar3 = local_138 + local_17c;
      alVar6 = blend_16_u8(src0_00,src1_00,v_m0_b_00,auVar4._8_8_,auVar4._0_8_);
      alVar6[0] = lVar3;
      xx_storeu_128((void *)(local_118 + local_17c),alVar6);
    }
    local_118 = local_118 + (ulong)in_ESI;
    local_138 = local_138 + (ulong)in_R9D;
    in_stack_00000008 = in_stack_00000008 + (ulong)(uint)v_res_b[0];
    v_m1_b[0]._0_4_ = (int)v_m1_b[0] + -1;
  } while ((int)v_m1_b[0] != 0);
  return;
}

Assistant:

static void blend_a64_mask_sx_w16n_sse4_1(
    uint8_t *dst, uint32_t dst_stride, const uint8_t *src0,
    uint32_t src0_stride, const uint8_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  const __m128i v_shuffle_b = xx_loadu_128(g_blend_a64_mask_shuffle);
  const __m128i v_maxval_b = _mm_set1_epi8(AOM_BLEND_A64_MAX_ALPHA);
  const __m128i _r = _mm_set1_epi16(1 << (15 - AOM_BLEND_A64_ROUND_BITS));

  do {
    int c;
    for (c = 0; c < w; c += 16) {
      const __m128i v_r0_b = xx_loadu_128(mask + 2 * c);
      const __m128i v_r1_b = xx_loadu_128(mask + 2 * c + 16);
      const __m128i v_r0_s_b = _mm_shuffle_epi8(v_r0_b, v_shuffle_b);
      const __m128i v_r1_s_b = _mm_shuffle_epi8(v_r1_b, v_shuffle_b);
      const __m128i v_r_lo_b = _mm_unpacklo_epi64(v_r0_s_b, v_r1_s_b);
      const __m128i v_r_hi_b = _mm_unpackhi_epi64(v_r0_s_b, v_r1_s_b);
      const __m128i v_m0_b = _mm_avg_epu8(v_r_lo_b, v_r_hi_b);
      const __m128i v_m1_b = _mm_sub_epi8(v_maxval_b, v_m0_b);

      const __m128i v_res_b =
          blend_16_u8(src0 + c, src1 + c, &v_m0_b, &v_m1_b, &_r);

      xx_storeu_128(dst + c, v_res_b);
    }
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += mask_stride;
  } while (--h);
}